

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O1

OUT * __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
::Current(OUT *__return_storage_ptr__,
         GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
         *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_color _Var2;
  IEnumerable<int_&> enumerable;
  shared_ptr<linq::IState<int_&>_> local_48;
  undefined **local_38;
  IState<int_&> *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  p_Var1 = (this->current)._M_node;
  local_30 = (IState<int_&> *)operator_new(0x20);
  local_30->_vptr_IState = (_func_int **)&PTR_Init_00158250;
  local_30[1]._vptr_IState = (_func_int **)&p_Var1[1]._M_parent;
  local_30[2]._vptr_IState = (_func_int **)0x0;
  local_30[3]._vptr_IState = (_func_int **)0x0;
  local_38 = &PTR_Init_00158638;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<linq::IState<int&>*>
            (&local_28,local_30);
  _Var2 = (this->current)._M_node[1]._M_color;
  local_48.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_30;
  local_48.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  IGrouping<bool,_int_&>::IGrouping(__return_storage_ptr__,SUB41(_Var2,0),&local_48);
  if (local_48.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_38 = &PTR_Init_00158638;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

OUT Current() const override 
			{ 
				decltype(auto) adapted = AdaptView(current->second);
				decltype(auto) enumerable = (IEnumerable<VALUE&>)(adapted);
				return OUT{current->first, enumerable.state}; 
			}